

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,int n)

{
  byte *pbVar1;
  uint uVar2;
  long lVar3;
  int n_local;
  
  n_local = n;
  lVar3 = 0;
  uVar2 = ~(this->IDStack).Data[(long)(this->IDStack).Size + -1];
  do {
    pbVar1 = (byte *)((long)&n_local + lVar3);
    lVar3 = lVar3 + 1;
    uVar2 = uVar2 >> 8 ^ GCrc32LookupTable[(uint)*pbVar1 ^ uVar2 & 0xff];
  } while (lVar3 != 4);
  return ~uVar2;
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(int n)
{
    ImGuiID seed = IDStack.back();
    return ImHashData(&n, sizeof(n), seed);
}